

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O3

string_t __thiscall
duckdb::DecimalToString::Format<duckdb::hugeint_t>
          (DecimalToString *this,hugeint_t value,uint8_t width,uint8_t scale,Vector *vector)

{
  int val;
  Vector *vector_00;
  char *dst;
  ulong uVar1;
  undefined4 uVar2;
  undefined7 in_register_00000009;
  idx_t len;
  undefined1 *puVar3;
  undefined7 in_register_00000081;
  string_t sVar4;
  hugeint_t value_00;
  string_t result;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 local_40 [16];
  
  uVar2 = (undefined4)CONCAT71(in_register_00000009,width);
  val = DecimalLength<duckdb::hugeint_t>(this,value,width,scale);
  vector_00 = (Vector *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_40 = (undefined1  [16])
             StringVector::EmptyString
                       ((StringVector *)CONCAT71(in_register_00000081,scale),vector_00,len);
  puVar3 = local_40._8_8_;
  if (local_40._0_4_ < 0xd) {
    puVar3 = local_40 + 4;
  }
  dst = (char *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  value_00.upper._4_4_ = 0;
  value_00._0_12_ = value._0_12_;
  FormatDecimal<duckdb::hugeint_t>
            (this,value_00,(uint8_t)uVar2,(uint8_t)puVar3,dst,
             CONCAT44(uVar2,in_stack_ffffffffffffffb8));
  uVar1 = (ulong)(uint)local_40._0_4_;
  if (uVar1 < 0xd) {
    switchD_01043a80::default(local_40 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_40._4_4_ = *(undefined4 *)local_40._8_8_;
  }
  sVar4.value.pointer.ptr = (char *)local_40._8_8_;
  sVar4.value._0_8_ = local_40._0_8_;
  return (string_t)sVar4.value;
}

Assistant:

string_t DecimalToString::Format(hugeint_t value, uint8_t width, uint8_t scale, Vector &vector) {
	int length = DecimalLength(value, width, scale);
	string_t result = StringVector::EmptyString(vector, NumericCast<idx_t>(length));

	auto dst = result.GetDataWriteable();

	FormatDecimal(value, width, scale, dst, NumericCast<idx_t>(length));

	result.Finalize();
	return result;
}